

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_sig(png_structrp png_ptr,png_inforp info_ptr)

{
  int iVar1;
  ulong start;
  size_t length;
  size_t num_to_check;
  size_t num_checked;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if (png_ptr->sig_bytes < 8) {
    start = (ulong)png_ptr->sig_bytes;
    length = -start + 8;
    png_ptr->io_state = 0x11;
    png_read_data(png_ptr,info_ptr->signature + start,length);
    png_ptr->sig_bytes = '\b';
    iVar1 = png_sig_cmp(info_ptr->signature,start,length);
    if (iVar1 != 0) {
      if ((start < 4) && (iVar1 = png_sig_cmp(info_ptr->signature,start,-start + 4), iVar1 != 0)) {
        png_error(png_ptr,"Not a PNG file");
      }
      png_error(png_ptr,"PNG file corrupted by ASCII conversion");
    }
    if (start < 3) {
      png_ptr->mode = png_ptr->mode | 0x1000;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_read_sig(png_structrp png_ptr, png_inforp info_ptr)
{
   size_t num_checked, num_to_check;

   /* Exit if the user application does not expect a signature. */
   if (png_ptr->sig_bytes >= 8)
      return;

   num_checked = png_ptr->sig_bytes;
   num_to_check = 8 - num_checked;

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_SIGNATURE;
#endif

   /* The signature must be serialized in a single I/O call. */
   png_read_data(png_ptr, &(info_ptr->signature[num_checked]), num_to_check);
   png_ptr->sig_bytes = 8;

   if (png_sig_cmp(info_ptr->signature, num_checked, num_to_check) != 0)
   {
      if (num_checked < 4 &&
          png_sig_cmp(info_ptr->signature, num_checked, num_to_check - 4))
         png_error(png_ptr, "Not a PNG file");
      else
         png_error(png_ptr, "PNG file corrupted by ASCII conversion");
   }
   if (num_checked < 3)
      png_ptr->mode |= PNG_HAVE_PNG_SIGNATURE;
}